

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

void __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::erase(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this,iterator __first,iterator __last)

{
  size_type sVar1;
  _Node *__last_00;
  _Node *__first_00;
  size_type local_60;
  size_type local_58;
  ulong local_48;
  size_type __n;
  size_type __l_bucket;
  size_type __f_bucket;
  hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  *this_local;
  iterator __last_local;
  iterator __first_local;
  
  __last_00 = __last._M_cur;
  __first_00 = __first._M_cur;
  if (__first_00 == (_Node *)0x0) {
    local_58 = std::
               vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
               ::size(&this->_M_buckets);
  }
  else {
    local_58 = _M_bkt_num(this,&__first_00->_M_val);
  }
  if (__last_00 == (_Node *)0x0) {
    local_60 = std::
               vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
               ::size(&this->_M_buckets);
  }
  else {
    local_60 = _M_bkt_num(this,&__last_00->_M_val);
  }
  if (__first_00 != __last_00) {
    if (local_58 == local_60) {
      _M_erase_bucket(this,local_58,__first_00,__last_00);
    }
    else {
      _M_erase_bucket(this,local_58,__first_00,(_Node *)0x0);
      while (local_48 = local_58 + 1, local_48 < local_60) {
        _M_erase_bucket(this,local_48,(_Node *)0x0);
        local_58 = local_48;
      }
      sVar1 = std::
              vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
              ::size(&this->_M_buckets);
      if (local_60 != sVar1) {
        _M_erase_bucket(this,local_60,__last_00);
      }
    }
  }
  return;
}

Assistant:

void hashtable<_Val, _Key, _HF, _Ex, _Eq, _All>::erase(iterator __first,
                                                       iterator __last)
{
  size_type __f_bucket =
    __first._M_cur ? _M_bkt_num(__first._M_cur->_M_val) : _M_buckets.size();
  size_type __l_bucket =
    __last._M_cur ? _M_bkt_num(__last._M_cur->_M_val) : _M_buckets.size();

  if (__first._M_cur == __last._M_cur)
    return;
  else if (__f_bucket == __l_bucket)
    _M_erase_bucket(__f_bucket, __first._M_cur, __last._M_cur);
  else {
    _M_erase_bucket(__f_bucket, __first._M_cur, 0);
    for (size_type __n = __f_bucket + 1; __n < __l_bucket; ++__n)
      _M_erase_bucket(__n, 0);
    if (__l_bucket != _M_buckets.size())
      _M_erase_bucket(__l_bucket, __last._M_cur);
  }
}